

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<8,_8,_257,_true,_embree::avx::VirtualCurveIntersectorK<8>,_true>::
     occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  size_t sVar4;
  ulong uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  ulong uVar22;
  char cVar23;
  bool bVar24;
  int iVar25;
  ulong uVar26;
  uint uVar27;
  undefined4 uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong extraout_RDX;
  ulong *puVar31;
  long lVar32;
  NodeRef root;
  undefined1 (*pauVar33) [32];
  undefined1 auVar34 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  float fVar47;
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 in_ZMM0 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar55;
  float fVar56;
  float fVar57;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  float fVar58;
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar68;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar64 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar77 [16];
  float in_register_0000131c;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  float fVar84;
  float in_register_0000135c;
  undefined1 auVar83 [64];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  vfloat4 a0;
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  float fVar97;
  float fVar102;
  float fVar103;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  undefined1 auVar101 [64];
  float fVar108;
  float fVar114;
  float fVar115;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar113 [64];
  undefined1 auVar120 [16];
  float fVar122;
  undefined1 auVar121 [64];
  float fVar123;
  undefined1 auVar124 [32];
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar125 [64];
  undefined1 in_ZMM14 [64];
  undefined1 auVar132 [32];
  vbool<8> terminated;
  TravRayK<8,_true> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  undefined1 local_5c80 [20];
  uint uStack_5c6c;
  undefined8 uStack_5c68;
  ulong local_5c58;
  BVH *local_5c50;
  RayK<8> *local_5c48;
  undefined8 *local_5c40;
  float fStack_5c38;
  float fStack_5c34;
  float fStack_5c30;
  float fStack_5c2c;
  float fStack_5c28;
  float fStack_5c24;
  undefined1 local_5c20 [32];
  size_t local_5c00;
  undefined8 uStack_5bf8;
  undefined8 uStack_5bf0;
  undefined8 uStack_5be8;
  undefined1 local_5be0 [32];
  undefined4 local_5bc0 [8];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5ba0;
  undefined1 local_5b40 [8];
  float fStack_5b38;
  float fStack_5b34;
  float fStack_5b30;
  float fStack_5b2c;
  float fStack_5b28;
  float fStack_5b24;
  undefined1 local_5b20 [8];
  float fStack_5b18;
  float fStack_5b14;
  float fStack_5b10;
  float fStack_5b0c;
  float fStack_5b08;
  float fStack_5b04;
  undefined1 local_5b00 [8];
  float fStack_5af8;
  float fStack_5af4;
  float fStack_5af0;
  float fStack_5aec;
  float fStack_5ae8;
  float fStack_5ae4;
  undefined1 local_5ae0 [8];
  float fStack_5ad8;
  float fStack_5ad4;
  float fStack_5ad0;
  float fStack_5acc;
  float fStack_5ac8;
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [32];
  undefined1 local_5a60 [32];
  undefined1 local_5a40 [32];
  undefined1 local_5a20 [32];
  undefined1 local_5a00 [64];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_59c0;
  undefined1 local_59a0 [16];
  undefined1 auStack_5990 [16];
  undefined1 auStack_5980 [368];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar35 [16];
  undefined1 auVar36 [28];
  undefined1 auVar76 [32];
  undefined1 auVar80 [32];
  undefined1 auVar91 [64];
  undefined1 auVar96 [64];
  
  local_5c50 = (BVH *)This->ptr;
  sVar4 = (local_5c50->root).ptr;
  if (sVar4 != 8) {
    auVar48 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar69 = vpcmpeqd_avx(auVar48,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
    auVar48 = vpcmpeqd_avx(auVar48,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
    auVar63 = *(undefined1 (*) [32])(ray + 0x100);
    auVar74 = vcmpps_avx(auVar63,ZEXT1632(ZEXT816(0) << 0x40),5);
    auVar51._16_16_ = auVar48;
    auVar51._0_16_ = auVar69;
    local_5be0 = vandps_avx(auVar74,auVar51);
    uVar27 = vmovmskps_avx(local_5be0);
    if (uVar27 != 0) {
      local_5c48 = ray + 0x100;
      _local_5b40 = *(undefined1 (*) [32])(ray + 0x80);
      _local_5b20 = *(undefined1 (*) [32])(ray + 0xa0);
      _local_5b00 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar78._0_4_ =
           local_5b40._0_4_ * local_5b40._0_4_ +
           local_5b00._0_4_ * local_5b00._0_4_ + local_5b20._0_4_ * local_5b20._0_4_;
      auVar78._4_4_ =
           local_5b40._4_4_ * local_5b40._4_4_ +
           local_5b00._4_4_ * local_5b00._4_4_ + local_5b20._4_4_ * local_5b20._4_4_;
      auVar78._8_4_ =
           local_5b40._8_4_ * local_5b40._8_4_ +
           local_5b00._8_4_ * local_5b00._8_4_ + local_5b20._8_4_ * local_5b20._8_4_;
      auVar78._12_4_ =
           local_5b40._12_4_ * local_5b40._12_4_ +
           local_5b00._12_4_ * local_5b00._12_4_ + local_5b20._12_4_ * local_5b20._12_4_;
      auVar78._16_4_ =
           local_5b40._16_4_ * local_5b40._16_4_ +
           local_5b00._16_4_ * local_5b00._16_4_ + local_5b20._16_4_ * local_5b20._16_4_;
      auVar78._20_4_ =
           local_5b40._20_4_ * local_5b40._20_4_ +
           local_5b00._20_4_ * local_5b00._20_4_ + local_5b20._20_4_ * local_5b20._20_4_;
      auVar78._24_4_ =
           local_5b40._24_4_ * local_5b40._24_4_ +
           local_5b00._24_4_ * local_5b00._24_4_ + local_5b20._24_4_ * local_5b20._24_4_;
      auVar78._28_4_ = in_register_0000135c + in_register_0000131c + in_register_0000135c;
      auVar74 = vrsqrtps_avx(auVar78);
      uVar29 = (ulong)(uVar27 & 0xff);
      fVar44 = auVar74._0_4_;
      fVar45 = auVar74._4_4_;
      fVar46 = auVar74._8_4_;
      fVar47 = auVar74._12_4_;
      fVar57 = auVar74._16_4_;
      fVar84 = auVar74._20_4_;
      fVar55 = auVar74._24_4_;
      local_59c0.v[0] = fVar44 * 1.5 + fVar44 * fVar44 * fVar44 * auVar78._0_4_ * -0.5;
      local_59c0.v[1] = fVar45 * 1.5 + fVar45 * fVar45 * fVar45 * auVar78._4_4_ * -0.5;
      local_59c0.v[2] = fVar46 * 1.5 + fVar46 * fVar46 * fVar46 * auVar78._8_4_ * -0.5;
      local_59c0.v[3] = fVar47 * 1.5 + fVar47 * fVar47 * fVar47 * auVar78._12_4_ * -0.5;
      local_59c0.v[4] = fVar57 * 1.5 + fVar57 * fVar57 * fVar57 * auVar78._16_4_ * -0.5;
      local_59c0.v[5] = fVar84 * 1.5 + fVar84 * fVar84 * fVar84 * auVar78._20_4_ * -0.5;
      local_59c0.v[6] = fVar55 * 1.5 + fVar55 * fVar55 * fVar55 * auVar78._24_4_ * -0.5;
      local_59c0.v[7] = auVar78._28_4_ + 1.5;
      auVar48._8_4_ = 0x80000000;
      auVar48._0_8_ = 0x8000000080000000;
      auVar48._12_4_ = 0x80000000;
      auVar69 = ZEXT816(0) << 0x20;
      while (uVar29 != 0) {
        lVar32 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
          }
        }
        auVar59 = vinsertps_avx(ZEXT416(*(uint *)(ray + lVar32 * 4 + 0x80)),
                                ZEXT416(*(uint *)(ray + lVar32 * 4 + 0xa0)),0x1c);
        auVar59 = vinsertps_avx(auVar59,ZEXT416(*(uint *)(ray + lVar32 * 4 + 0xc0)),0x28);
        fVar44 = *(float *)((long)&local_59c0 + lVar32 * 4);
        auVar92._0_4_ = auVar59._0_4_ * fVar44;
        auVar92._4_4_ = auVar59._4_4_ * fVar44;
        auVar92._8_4_ = auVar59._8_4_ * fVar44;
        auVar92._12_4_ = auVar59._12_4_ * fVar44;
        auVar110 = vshufpd_avx(auVar92,auVar92,1);
        auVar59 = vmovshdup_avx(auVar92);
        auVar98 = vunpckhps_avx(auVar92,auVar69);
        auVar109._8_8_ = 0;
        auVar109._0_8_ = (ulong)auVar59._0_4_ ^ 0x80000000;
        auVar99 = vshufps_avx(auVar98,auVar109,0x41);
        auVar98._0_8_ = auVar110._0_8_ ^ 0x8000000080000000;
        auVar98._8_8_ = auVar110._8_8_ ^ auVar48._8_8_;
        auVar98 = vinsertps_avx(auVar98,auVar92,0x2a);
        auVar59 = vdpps_avx(auVar99,auVar99,0x7f);
        auVar110 = vdpps_avx(auVar98,auVar98,0x7f);
        auVar59 = vcmpps_avx(auVar110,auVar59,1);
        auVar59 = vshufps_avx(auVar59,auVar59,0);
        auVar59 = vblendvps_avx(auVar98,auVar99,auVar59);
        auVar110 = vdpps_avx(auVar59,auVar59,0x7f);
        auVar98 = vrsqrtss_avx(auVar110,auVar110);
        fVar45 = auVar98._0_4_;
        auVar110 = ZEXT416((uint)(fVar45 * 1.5 - auVar110._0_4_ * 0.5 * fVar45 * fVar45 * fVar45));
        auVar110 = vshufps_avx(auVar110,auVar110,0);
        auVar99._0_4_ = auVar59._0_4_ * auVar110._0_4_;
        auVar99._4_4_ = auVar59._4_4_ * auVar110._4_4_;
        auVar99._8_4_ = auVar59._8_4_ * auVar110._8_4_;
        auVar99._12_4_ = auVar59._12_4_ * auVar110._12_4_;
        auVar59 = vshufps_avx(auVar99,auVar99,0xc9);
        auVar110 = vshufps_avx(auVar92,auVar92,0xc9);
        auVar120._0_4_ = auVar110._0_4_ * auVar99._0_4_;
        auVar120._4_4_ = auVar110._4_4_ * auVar99._4_4_;
        auVar120._8_4_ = auVar110._8_4_ * auVar99._8_4_;
        auVar120._12_4_ = auVar110._12_4_ * auVar99._12_4_;
        auVar110._0_4_ = auVar92._0_4_ * auVar59._0_4_;
        auVar110._4_4_ = auVar92._4_4_ * auVar59._4_4_;
        auVar110._8_4_ = auVar92._8_4_ * auVar59._8_4_;
        auVar110._12_4_ = auVar92._12_4_ * auVar59._12_4_;
        auVar59 = vsubps_avx(auVar110,auVar120);
        auVar98 = vshufps_avx(auVar59,auVar59,0xc9);
        auVar59 = vdpps_avx(auVar98,auVar98,0x7f);
        uVar29 = uVar29 & uVar29 - 1;
        auVar110 = vrsqrtss_avx(auVar59,auVar59);
        fVar45 = auVar110._0_4_;
        in_ZMM14 = ZEXT464((uint)(fVar45 * 1.5));
        auVar59 = ZEXT416((uint)(fVar45 * 1.5 - auVar59._0_4_ * 0.5 * fVar45 * fVar45 * fVar45));
        auVar59 = vshufps_avx(auVar59,auVar59,0);
        auVar111._0_4_ = auVar59._0_4_ * auVar98._0_4_;
        auVar111._4_4_ = auVar59._4_4_ * auVar98._4_4_;
        auVar111._8_4_ = auVar59._8_4_ * auVar98._8_4_;
        auVar111._12_4_ = auVar59._12_4_ * auVar98._12_4_;
        auVar59._0_4_ = fVar44 * auVar92._0_4_;
        auVar59._4_4_ = fVar44 * auVar92._4_4_;
        auVar59._8_4_ = fVar44 * auVar92._8_4_;
        auVar59._12_4_ = fVar44 * auVar92._12_4_;
        auVar98 = vunpcklps_avx(auVar99,auVar59);
        auVar59 = vunpckhps_avx(auVar99,auVar59);
        auVar99 = vunpcklps_avx(auVar111,auVar69);
        auVar110 = vunpckhps_avx(auVar111,auVar69);
        auVar110 = vunpcklps_avx(auVar59,auVar110);
        auVar92 = vunpcklps_avx(auVar98,auVar99);
        auVar59 = vunpckhps_avx(auVar98,auVar99);
        lVar32 = lVar32 * 0x30;
        *(undefined1 (*) [16])(local_59a0 + lVar32) = auVar92;
        *(undefined1 (*) [16])(auStack_5990 + lVar32) = auVar59;
        *(undefined1 (*) [16])(auStack_5980 + lVar32) = auVar110;
      }
      local_5ba0._0_4_ = (undefined4)*(undefined8 *)ray;
      local_5ba0._4_4_ = (undefined4)((ulong)*(undefined8 *)ray >> 0x20);
      local_5ba0._8_4_ = (undefined4)*(undefined8 *)(ray + 8);
      local_5ba0._12_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 8) >> 0x20);
      local_5ba0._16_4_ = (undefined4)*(undefined8 *)(ray + 0x10);
      local_5ba0._20_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x10) >> 0x20);
      local_5ba0._24_4_ = (undefined4)*(undefined8 *)(ray + 0x18);
      local_5ba0._28_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x18) >> 0x20);
      local_5ba0._32_4_ = (undefined4)*(undefined8 *)(ray + 0x20);
      local_5ba0._36_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x20) >> 0x20);
      local_5ba0._40_4_ = (undefined4)*(undefined8 *)(ray + 0x28);
      local_5ba0._44_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x28) >> 0x20);
      local_5ba0._48_4_ = (undefined4)*(undefined8 *)(ray + 0x30);
      local_5ba0._52_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x30) >> 0x20);
      local_5ba0._56_4_ = (undefined4)*(undefined8 *)(ray + 0x38);
      local_5ba0._60_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x38) >> 0x20);
      local_5ba0._64_4_ = (undefined4)*(undefined8 *)(ray + 0x40);
      local_5ba0._68_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x40) >> 0x20);
      local_5ba0._72_4_ = (undefined4)*(undefined8 *)(ray + 0x48);
      local_5ba0._76_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x48) >> 0x20);
      local_5ba0._80_4_ = (undefined4)*(undefined8 *)(ray + 0x50);
      local_5ba0._84_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
      local_5ba0._88_4_ = (undefined4)*(undefined8 *)(ray + 0x58);
      local_5ba0._92_4_ = (undefined4)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
      auVar85._8_4_ = 0x7fffffff;
      auVar85._0_8_ = 0x7fffffff7fffffff;
      auVar85._12_4_ = 0x7fffffff;
      auVar85._16_4_ = 0x7fffffff;
      auVar85._20_4_ = 0x7fffffff;
      auVar85._24_4_ = 0x7fffffff;
      auVar85._28_4_ = 0x7fffffff;
      auVar89._8_4_ = 0x219392ef;
      auVar89._0_8_ = 0x219392ef219392ef;
      auVar89._12_4_ = 0x219392ef;
      auVar89._16_4_ = 0x219392ef;
      auVar89._20_4_ = 0x219392ef;
      auVar89._24_4_ = 0x219392ef;
      auVar89._28_4_ = 0x219392ef;
      auVar91 = ZEXT3264(auVar89);
      auVar93._8_4_ = 0x3f800000;
      auVar93._0_8_ = 0x3f8000003f800000;
      auVar93._12_4_ = 0x3f800000;
      auVar93._16_4_ = 0x3f800000;
      auVar93._20_4_ = 0x3f800000;
      auVar93._24_4_ = 0x3f800000;
      auVar93._28_4_ = 0x3f800000;
      auVar96 = ZEXT3264(auVar93);
      auVar71 = vdivps_avx(auVar93,_local_5b40);
      auVar74 = vandps_avx(_local_5b40,auVar85);
      auVar51 = vcmpps_avx(auVar74,auVar89,1);
      auVar74 = vandps_avx(_local_5b20,auVar85);
      auVar78 = vcmpps_avx(auVar74,auVar89,1);
      auVar72 = vdivps_avx(auVar93,_local_5b20);
      auVar74 = vandps_avx(_local_5b00,auVar85);
      auVar87._8_4_ = 0x5d5e0b6b;
      auVar87._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar87._12_4_ = 0x5d5e0b6b;
      auVar87._16_4_ = 0x5d5e0b6b;
      auVar87._20_4_ = 0x5d5e0b6b;
      auVar87._24_4_ = 0x5d5e0b6b;
      auVar87._28_4_ = 0x5d5e0b6b;
      _local_5ae0 = vblendvps_avx(auVar71,auVar87,auVar51);
      auVar74 = vcmpps_avx(auVar74,auVar89,1);
      auVar51 = vdivps_avx(auVar93,_local_5b00);
      local_5ac0 = vblendvps_avx(auVar72,auVar87,auVar78);
      local_5aa0 = vblendvps_avx(auVar51,auVar87,auVar74);
      auVar83 = ZEXT864(0) << 0x20;
      auVar74 = vcmpps_avx(_local_5ae0,ZEXT832(0) << 0x20,1);
      auVar71._8_4_ = 0x20;
      auVar71._0_8_ = 0x2000000020;
      auVar71._12_4_ = 0x20;
      auVar71._16_4_ = 0x20;
      auVar71._20_4_ = 0x20;
      auVar71._24_4_ = 0x20;
      auVar71._28_4_ = 0x20;
      local_5a80 = vandps_avx(auVar74,auVar71);
      auVar74 = vcmpps_avx(local_5ac0,ZEXT832(0) << 0x20,5);
      auVar72._8_4_ = 0x40;
      auVar72._0_8_ = 0x4000000040;
      auVar72._12_4_ = 0x40;
      auVar72._16_4_ = 0x40;
      auVar72._20_4_ = 0x40;
      auVar72._24_4_ = 0x40;
      auVar72._28_4_ = 0x40;
      auVar86._8_4_ = 0x60;
      auVar86._0_8_ = 0x6000000060;
      auVar86._12_4_ = 0x60;
      auVar86._16_4_ = 0x60;
      auVar86._20_4_ = 0x60;
      auVar86._24_4_ = 0x60;
      auVar86._28_4_ = 0x60;
      local_5a60 = vblendvps_avx(auVar86,auVar72,auVar74);
      auVar51 = ZEXT832(0) << 0x20;
      auVar74 = vcmpps_avx(local_5aa0,auVar51,5);
      auVar73._8_4_ = 0x80;
      auVar73._0_8_ = 0x8000000080;
      auVar73._12_4_ = 0x80;
      auVar73._16_4_ = 0x80;
      auVar73._20_4_ = 0x80;
      auVar73._24_4_ = 0x80;
      auVar73._28_4_ = 0x80;
      auVar79._8_4_ = 0xa0;
      auVar79._0_8_ = 0xa0000000a0;
      auVar79._12_4_ = 0xa0;
      auVar79._16_4_ = 0xa0;
      auVar79._20_4_ = 0xa0;
      auVar79._24_4_ = 0xa0;
      auVar79._28_4_ = 0xa0;
      local_5a40 = vblendvps_avx(auVar79,auVar73,auVar74);
      auVar74 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar51);
      local_4680._8_4_ = 0x7f800000;
      local_4680._0_8_ = 0x7f8000007f800000;
      local_4680._12_4_ = 0x7f800000;
      local_4680._16_4_ = 0x7f800000;
      local_4680._20_4_ = 0x7f800000;
      local_4680._24_4_ = 0x7f800000;
      local_4680._28_4_ = 0x7f800000;
      auVar101 = ZEXT3264(local_4680);
      auVar64 = ZEXT3264(local_5be0);
      local_5a20 = vblendvps_avx(local_4680,auVar74,local_5be0);
      auVar63 = vmaxps_avx(auVar63,auVar51);
      auVar74._8_4_ = 0xff800000;
      auVar74._0_8_ = 0xff800000ff800000;
      auVar74._12_4_ = 0xff800000;
      auVar74._16_4_ = 0xff800000;
      auVar74._20_4_ = 0xff800000;
      auVar74._24_4_ = 0xff800000;
      auVar74._28_4_ = 0xff800000;
      local_5a00._0_32_ = vblendvps_avx(auVar74,auVar63,local_5be0);
      auVar63 = vcmpps_avx(local_5a00._0_32_,local_5a00._0_32_,0xf);
      local_5c80._4_4_ = local_5be0._4_4_ ^ auVar63._4_4_;
      local_5c80._0_4_ = local_5be0._0_4_ ^ auVar63._0_4_;
      local_5c80._8_4_ = local_5be0._8_4_ ^ auVar63._8_4_;
      local_5c80._12_4_ = local_5be0._12_4_ ^ auVar63._12_4_;
      local_5c80._16_4_ = local_5be0._16_4_ ^ auVar63._16_4_;
      uStack_5c6c = local_5be0._20_4_ ^ auVar63._20_4_;
      uStack_5c68._0_4_ = local_5be0._24_4_ ^ auVar63._24_4_;
      uStack_5c68._4_4_ = local_5be0._28_4_ ^ auVar63._28_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar29 = 7;
      }
      else {
        uVar29 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                        RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
      }
      uVar30 = 0;
      puVar31 = local_5800;
      local_5810 = 0xfffffffffffffff8;
      pauVar33 = (undefined1 (*) [32])local_4640;
      local_5808 = sVar4;
      local_4660 = local_5a20;
      local_5a00._32_8_ = mm_lookupmask_ps._16_8_;
      local_5a00._40_8_ = mm_lookupmask_ps._24_8_;
      local_5a00._48_8_ = mm_lookupmask_ps._16_8_;
      local_5a00._56_8_ = mm_lookupmask_ps._24_8_;
      auVar113 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                    CONCAT424(0x3f7ffffa,
                                              CONCAT420(0x3f7ffffa,
                                                        CONCAT416(0x3f7ffffa,
                                                                  CONCAT412(0x3f7ffffa,
                                                                            CONCAT48(0x3f7ffffa,
                                                                                                                                                                          
                                                  0x3f7ffffa3f7ffffa)))))));
      auVar121 = ZEXT3264(CONCAT428(0x3f800003,
                                    CONCAT424(0x3f800003,
                                              CONCAT420(0x3f800003,
                                                        CONCAT416(0x3f800003,
                                                                  CONCAT412(0x3f800003,
                                                                            CONCAT48(0x3f800003,
                                                                                                                                                                          
                                                  0x3f8000033f800003)))))));
LAB_01034bbb:
      do {
        do {
          root.ptr = puVar31[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0103532d;
          puVar31 = puVar31 + -1;
          pauVar33 = pauVar33 + -1;
          auVar63 = *pauVar33;
          auVar125 = ZEXT3264(auVar63);
          auVar74 = vcmpps_avx(auVar63,local_5a00._0_32_,1);
        } while ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                      (auVar74 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar74 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    SUB321(auVar74 >> 0x7f,0) == '\0') &&
                   (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  SUB321(auVar74 >> 0xbf,0) == '\0') &&
                 (auVar74 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 -1 < auVar74[0x1f]);
        uVar28 = vmovmskps_avx(auVar74);
        local_5c40 = (undefined8 *)CONCAT44((int)(uVar30 >> 0x20),uVar28);
        uVar30 = (ulong)local_5c40;
        uVar26 = (ulong)(uint)POPCOUNT(uVar28);
        if (uVar29 < (uint)POPCOUNT(uVar28)) {
LAB_01034bf8:
          do {
            lVar32 = 0x38;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0103532d;
              auVar63 = vcmpps_avx(local_5a00._0_32_,auVar125._0_32_,6);
              if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar63 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar63 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar63 >> 0x7f,0) != '\0') ||
                    (auVar63 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar63 >> 0xbf,0) != '\0') ||
                  (auVar63 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar63[0x1f] < '\0') {
                local_5c00 = local_5c80._0_8_;
                uStack_5bf8 = local_5c80._8_8_;
                uStack_5bf0 = stack0xffffffffffffa390;
                uStack_5be8 = uStack_5c68;
                local_5bc0[0] = local_5a00._32_4_;
                local_5bc0[1] = local_5a00._36_4_;
                local_5bc0[2] = local_5a00._40_4_;
                local_5bc0[3] = local_5a00._44_4_;
                local_5bc0[4] = local_5a00._48_4_;
                local_5bc0[5] = local_5a00._52_4_;
                local_5bc0[6] = local_5a00._56_4_;
                local_5bc0[7] = local_5a00._60_4_;
                auVar48 = vpcmpeqd_avx(auVar64._0_16_,auVar64._0_16_);
                auVar64 = ZEXT1664(auVar48);
                auVar69 = vpcmpgtd_avx(stack0xffffffffffffa390,auVar48);
                auVar48 = vpcmpgtd_avx(local_5c80._0_16_,auVar48);
                auVar43._16_16_ = auVar69;
                auVar43._0_16_ = auVar48;
                uVar27 = vmovmskps_avx(auVar43);
                uVar26 = (ulong)uVar27;
                local_5c40 = (undefined8 *)
                             ((long)This->leafIntersector +
                             (ulong)*(byte *)(root.ptr & 0xfffffffffffffff0) * 0x40 + 0x28);
                while (auVar48 = auVar64._0_16_, uVar26 != 0) {
                  lVar32 = 0;
                  if (uVar26 != 0) {
                    for (; (uVar26 >> lVar32 & 1) == 0; lVar32 = lVar32 + 1) {
                    }
                  }
                  uVar26 = uVar26 & uVar26 - 1;
                  local_5c20._0_8_ = lVar32;
                  auVar64 = ZEXT1664(auVar48);
                  auVar83 = ZEXT1664(auVar83._0_16_);
                  auVar91 = ZEXT1664(auVar91._0_16_);
                  auVar96 = ZEXT1664(auVar96._0_16_);
                  in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
                  cVar23 = (*(code *)*local_5c40)
                                     (&local_59c0,ray,lVar32,context,
                                      (byte *)(root.ptr & 0xfffffffffffffff0));
                  auVar121 = ZEXT3264(CONCAT428(0x3f800003,
                                                CONCAT424(0x3f800003,
                                                          CONCAT420(0x3f800003,
                                                                    CONCAT416(0x3f800003,
                                                                              CONCAT412(0x3f800003,
                                                                                        CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                  auVar113 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                CONCAT424(0x3f7ffffa,
                                                          CONCAT420(0x3f7ffffa,
                                                                    CONCAT416(0x3f7ffffa,
                                                                              CONCAT412(0x3f7ffffa,
                                                                                        CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                  auVar101 = ZEXT3264(CONCAT428(0x7f800000,
                                                CONCAT424(0x7f800000,
                                                          CONCAT420(0x7f800000,
                                                                    CONCAT416(0x7f800000,
                                                                              CONCAT412(0x7f800000,
                                                                                        CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  uVar30 = extraout_RDX;
                  if (cVar23 != '\0') {
                    local_5bc0[local_5c20._0_8_] = 0xffffffff;
                  }
                }
                auVar17._8_8_ = uStack_5bf8;
                auVar17._0_8_ = local_5c00;
                auVar17._16_8_ = uStack_5bf0;
                auVar17._24_8_ = uStack_5be8;
                auVar18._8_4_ = local_5bc0[2];
                auVar18._12_4_ = local_5bc0[3];
                auVar18._0_4_ = local_5bc0[0];
                auVar18._4_4_ = local_5bc0[1];
                auVar18._16_4_ = local_5bc0[4];
                auVar18._20_4_ = local_5bc0[5];
                auVar18._24_4_ = local_5bc0[6];
                auVar18._28_4_ = local_5bc0[7];
                _local_5c80 = vorps_avx(auVar17,auVar18);
                auVar48 = vpcmpeqd_avx(auVar48,auVar48);
                auVar69 = vpcmpgtd_avx(local_5c80._16_16_,auVar48);
                auVar48 = vpcmpgtd_avx(local_5c80._0_16_,auVar48);
                auVar48 = vpor_avx(auVar48,auVar69);
                if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar48 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar48 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar48[0xf]) goto LAB_0103532d;
                auVar62._8_4_ = 0xff800000;
                auVar62._0_8_ = 0xff800000ff800000;
                auVar62._12_4_ = 0xff800000;
                auVar62._16_4_ = 0xff800000;
                auVar62._20_4_ = 0xff800000;
                auVar62._24_4_ = 0xff800000;
                auVar62._28_4_ = 0xff800000;
                auVar64 = ZEXT3264(auVar62);
                local_5a00._0_32_ = vblendvps_avx(local_5a00._0_32_,auVar62,_local_5c80);
              }
              goto LAB_01034bbb;
            }
            uVar26 = root.ptr & 0xfffffffffffffff0;
            auVar63 = auVar101._0_32_;
            uVar30 = 8;
            for (; (auVar125 = ZEXT3264(auVar63), lVar32 != 0x40 &&
                   (uVar5 = *(ulong *)((uVar26 - 0x1c0) + lVar32 * 8), uVar5 != 8));
                lVar32 = lVar32 + 1) {
              auVar64._28_36_ = auVar83._28_36_;
              auVar83._28_36_ = auVar91._28_36_;
              auVar91._28_36_ = auVar96._28_36_;
              if ((root.ptr & 7) == 0) {
                uVar28 = *(undefined4 *)((root.ptr - 0xa0) + lVar32 * 4);
                auVar37._4_4_ = uVar28;
                auVar37._0_4_ = uVar28;
                auVar37._8_4_ = uVar28;
                auVar37._12_4_ = uVar28;
                auVar37._16_4_ = uVar28;
                auVar37._20_4_ = uVar28;
                auVar37._24_4_ = uVar28;
                auVar37._28_4_ = uVar28;
                auVar19._4_4_ = local_5ba0._4_4_;
                auVar19._0_4_ = local_5ba0._0_4_;
                auVar19._8_4_ = local_5ba0._8_4_;
                auVar19._12_4_ = local_5ba0._12_4_;
                auVar19._16_4_ = local_5ba0._16_4_;
                auVar19._20_4_ = local_5ba0._20_4_;
                auVar19._24_4_ = local_5ba0._24_4_;
                auVar19._28_4_ = local_5ba0._28_4_;
                auVar20._4_4_ = local_5ba0._36_4_;
                auVar20._0_4_ = local_5ba0._32_4_;
                auVar20._8_4_ = local_5ba0._40_4_;
                auVar20._12_4_ = local_5ba0._44_4_;
                auVar20._16_4_ = local_5ba0._48_4_;
                auVar20._20_4_ = local_5ba0._52_4_;
                auVar20._24_4_ = local_5ba0._56_4_;
                auVar20._28_4_ = local_5ba0._60_4_;
                auVar21._4_4_ = local_5ba0._68_4_;
                auVar21._0_4_ = local_5ba0._64_4_;
                auVar21._8_4_ = local_5ba0._72_4_;
                auVar21._12_4_ = local_5ba0._76_4_;
                auVar21._16_4_ = local_5ba0._80_4_;
                auVar21._20_4_ = local_5ba0._84_4_;
                auVar21._24_4_ = local_5ba0._88_4_;
                auVar21._28_4_ = local_5ba0._92_4_;
                auVar74 = vsubps_avx(auVar37,auVar19);
                auVar64._0_4_ = (float)local_5ae0._0_4_ * auVar74._0_4_;
                auVar64._4_4_ = (float)local_5ae0._4_4_ * auVar74._4_4_;
                auVar64._8_4_ = fStack_5ad8 * auVar74._8_4_;
                auVar64._12_4_ = fStack_5ad4 * auVar74._12_4_;
                auVar64._16_4_ = fStack_5ad0 * auVar74._16_4_;
                auVar64._20_4_ = fStack_5acc * auVar74._20_4_;
                auVar64._24_4_ = fStack_5ac8 * auVar74._24_4_;
                auVar82 = auVar64._0_32_;
                uVar28 = *(undefined4 *)((root.ptr - 0x60) + lVar32 * 4);
                auVar38._4_4_ = uVar28;
                auVar38._0_4_ = uVar28;
                auVar38._8_4_ = uVar28;
                auVar38._12_4_ = uVar28;
                auVar38._16_4_ = uVar28;
                auVar38._20_4_ = uVar28;
                auVar38._24_4_ = uVar28;
                auVar38._28_4_ = uVar28;
                auVar74 = vsubps_avx(auVar38,auVar20);
                uVar28 = *(undefined4 *)((root.ptr - 0x20) + lVar32 * 4);
                auVar88._4_4_ = uVar28;
                auVar88._0_4_ = uVar28;
                auVar88._8_4_ = uVar28;
                auVar88._12_4_ = uVar28;
                auVar88._16_4_ = uVar28;
                auVar88._20_4_ = uVar28;
                auVar88._24_4_ = uVar28;
                auVar88._28_4_ = uVar28;
                auVar83._0_4_ = local_5ac0._0_4_ * auVar74._0_4_;
                auVar83._4_4_ = local_5ac0._4_4_ * auVar74._4_4_;
                auVar83._8_4_ = local_5ac0._8_4_ * auVar74._8_4_;
                auVar83._12_4_ = local_5ac0._12_4_ * auVar74._12_4_;
                auVar83._16_4_ = local_5ac0._16_4_ * auVar74._16_4_;
                auVar83._20_4_ = local_5ac0._20_4_ * auVar74._20_4_;
                auVar83._24_4_ = local_5ac0._24_4_ * auVar74._24_4_;
                auVar90 = auVar83._0_32_;
                auVar74 = vsubps_avx(auVar88,auVar21);
                auVar91._0_4_ = local_5aa0._0_4_ * auVar74._0_4_;
                auVar91._4_4_ = local_5aa0._4_4_ * auVar74._4_4_;
                auVar91._8_4_ = local_5aa0._8_4_ * auVar74._8_4_;
                auVar91._12_4_ = local_5aa0._12_4_ * auVar74._12_4_;
                auVar91._16_4_ = local_5aa0._16_4_ * auVar74._16_4_;
                auVar91._20_4_ = local_5aa0._20_4_ * auVar74._20_4_;
                auVar91._24_4_ = local_5aa0._24_4_ * auVar74._24_4_;
                auVar78 = auVar91._0_32_;
                auVar96 = ZEXT3264(auVar78);
                uVar28 = *(undefined4 *)((root.ptr - 0x80) + lVar32 * 4);
                auVar39._4_4_ = uVar28;
                auVar39._0_4_ = uVar28;
                auVar39._8_4_ = uVar28;
                auVar39._12_4_ = uVar28;
                auVar39._16_4_ = uVar28;
                auVar39._20_4_ = uVar28;
                auVar39._24_4_ = uVar28;
                auVar39._28_4_ = uVar28;
                auVar74 = vsubps_avx(auVar39,auVar19);
                auVar6._4_4_ = (float)local_5ae0._4_4_ * auVar74._4_4_;
                auVar6._0_4_ = (float)local_5ae0._0_4_ * auVar74._0_4_;
                auVar6._8_4_ = fStack_5ad8 * auVar74._8_4_;
                auVar6._12_4_ = fStack_5ad4 * auVar74._12_4_;
                auVar6._16_4_ = fStack_5ad0 * auVar74._16_4_;
                auVar6._20_4_ = fStack_5acc * auVar74._20_4_;
                auVar6._24_4_ = fStack_5ac8 * auVar74._24_4_;
                auVar6._28_4_ = local_5ba0._28_4_;
                uVar28 = *(undefined4 *)((root.ptr - 0x40) + lVar32 * 4);
                auVar40._4_4_ = uVar28;
                auVar40._0_4_ = uVar28;
                auVar40._8_4_ = uVar28;
                auVar40._12_4_ = uVar28;
                auVar40._16_4_ = uVar28;
                auVar40._20_4_ = uVar28;
                auVar40._24_4_ = uVar28;
                auVar40._28_4_ = uVar28;
                auVar74 = vsubps_avx(auVar40,auVar20);
                auVar7._4_4_ = local_5ac0._4_4_ * auVar74._4_4_;
                auVar7._0_4_ = local_5ac0._0_4_ * auVar74._0_4_;
                auVar7._8_4_ = local_5ac0._8_4_ * auVar74._8_4_;
                auVar7._12_4_ = local_5ac0._12_4_ * auVar74._12_4_;
                auVar7._16_4_ = local_5ac0._16_4_ * auVar74._16_4_;
                auVar7._20_4_ = local_5ac0._20_4_ * auVar74._20_4_;
                auVar7._24_4_ = local_5ac0._24_4_ * auVar74._24_4_;
                auVar7._28_4_ = local_5ba0._60_4_;
                uVar28 = *(undefined4 *)(root.ptr + lVar32 * 4);
                auVar41._4_4_ = uVar28;
                auVar41._0_4_ = uVar28;
                auVar41._8_4_ = uVar28;
                auVar41._12_4_ = uVar28;
                auVar41._16_4_ = uVar28;
                auVar41._20_4_ = uVar28;
                auVar41._24_4_ = uVar28;
                auVar41._28_4_ = uVar28;
                auVar74 = vsubps_avx(auVar41,auVar21);
                auVar8._4_4_ = local_5aa0._4_4_ * auVar74._4_4_;
                auVar8._0_4_ = local_5aa0._0_4_ * auVar74._0_4_;
                auVar8._8_4_ = local_5aa0._8_4_ * auVar74._8_4_;
                auVar8._12_4_ = local_5aa0._12_4_ * auVar74._12_4_;
                auVar8._16_4_ = local_5aa0._16_4_ * auVar74._16_4_;
                auVar8._20_4_ = local_5aa0._20_4_ * auVar74._20_4_;
                auVar8._24_4_ = local_5aa0._24_4_ * auVar74._24_4_;
                auVar8._28_4_ = local_5ba0._92_4_;
                auVar74 = vminps_avx(auVar82,auVar6);
                auVar51 = vminps_avx(auVar90,auVar7);
                auVar74 = vmaxps_avx(auVar74,auVar51);
                auVar51 = vminps_avx(auVar78,auVar8);
                auVar74 = vmaxps_avx(auVar74,auVar51);
                auVar42._4_4_ = auVar113._4_4_ * auVar74._4_4_;
                auVar42._0_4_ = auVar113._0_4_ * auVar74._0_4_;
                auVar42._8_4_ = auVar113._8_4_ * auVar74._8_4_;
                auVar42._12_4_ = auVar113._12_4_ * auVar74._12_4_;
                auVar42._16_4_ = auVar113._16_4_ * auVar74._16_4_;
                auVar42._20_4_ = auVar113._20_4_ * auVar74._20_4_;
                auVar42._24_4_ = auVar113._24_4_ * auVar74._24_4_;
                auVar42._28_4_ = auVar74._28_4_;
                auVar74 = vmaxps_avx(auVar82,auVar6);
                auVar51 = vmaxps_avx(auVar90,auVar7);
                auVar51 = vminps_avx(auVar74,auVar51);
                auVar74 = vmaxps_avx(auVar78,auVar8);
                auVar74 = vminps_avx(auVar51,auVar74);
                auVar9._4_4_ = auVar121._4_4_ * auVar74._4_4_;
                auVar9._0_4_ = auVar121._0_4_ * auVar74._0_4_;
                auVar9._8_4_ = auVar121._8_4_ * auVar74._8_4_;
                auVar9._12_4_ = auVar121._12_4_ * auVar74._12_4_;
                auVar9._16_4_ = auVar121._16_4_ * auVar74._16_4_;
                auVar9._20_4_ = auVar121._20_4_ * auVar74._20_4_;
                auVar9._24_4_ = auVar121._24_4_ * auVar74._24_4_;
                auVar9._28_4_ = auVar74._28_4_;
                auVar61 = vmaxps_avx(auVar42,local_5a20);
                auVar53 = vminps_avx(auVar9,local_5a00._0_32_);
              }
              else {
                fVar44 = *(float *)((uVar26 - 0xa0) + lVar32 * 4);
                fVar45 = *(float *)((uVar26 - 0x80) + lVar32 * 4);
                fVar46 = *(float *)((uVar26 - 0x60) + lVar32 * 4);
                fVar47 = *(float *)((uVar26 - 0x40) + lVar32 * 4);
                fVar57 = *(float *)((uVar26 - 0x20) + lVar32 * 4);
                fVar84 = *(float *)(uVar26 + lVar32 * 4);
                fVar55 = *(float *)(uVar26 + 0x20 + lVar32 * 4);
                fVar1 = *(float *)(uVar26 + 0x40 + lVar32 * 4);
                fVar2 = *(float *)(uVar26 + 0x60 + lVar32 * 4);
                fStack_5c38 = *(float *)(uVar26 + 0x80 + lVar32 * 4);
                fVar122 = in_ZMM14._28_4_ + auVar121._28_4_;
                auVar112._0_4_ =
                     (float)local_5b40._0_4_ * fVar44 +
                     (float)local_5b20._0_4_ * fVar47 + fVar55 * (float)local_5b00._0_4_;
                auVar112._4_4_ =
                     (float)local_5b40._4_4_ * fVar44 +
                     (float)local_5b20._4_4_ * fVar47 + fVar55 * (float)local_5b00._4_4_;
                auVar112._8_4_ = fStack_5b38 * fVar44 + fStack_5b18 * fVar47 + fVar55 * fStack_5af8;
                auVar112._12_4_ = fStack_5b34 * fVar44 + fStack_5b14 * fVar47 + fVar55 * fStack_5af4
                ;
                auVar112._16_4_ = fStack_5b30 * fVar44 + fStack_5b10 * fVar47 + fVar55 * fStack_5af0
                ;
                auVar112._20_4_ = fStack_5b2c * fVar44 + fStack_5b0c * fVar47 + fVar55 * fStack_5aec
                ;
                auVar112._24_4_ = fStack_5b28 * fVar44 + fStack_5b08 * fVar47 + fVar55 * fStack_5ae8
                ;
                auVar112._28_4_ = fStack_5ae4 + fVar122;
                auVar124._0_4_ =
                     (float)local_5b40._0_4_ * fVar45 +
                     (float)local_5b20._0_4_ * fVar57 + (float)local_5b00._0_4_ * fVar1;
                auVar124._4_4_ =
                     (float)local_5b40._4_4_ * fVar45 +
                     (float)local_5b20._4_4_ * fVar57 + (float)local_5b00._4_4_ * fVar1;
                auVar124._8_4_ = fStack_5b38 * fVar45 + fStack_5b18 * fVar57 + fStack_5af8 * fVar1;
                auVar124._12_4_ = fStack_5b34 * fVar45 + fStack_5b14 * fVar57 + fStack_5af4 * fVar1;
                auVar124._16_4_ = fStack_5b30 * fVar45 + fStack_5b10 * fVar57 + fStack_5af0 * fVar1;
                auVar124._20_4_ = fStack_5b2c * fVar45 + fStack_5b0c * fVar57 + fStack_5aec * fVar1;
                auVar124._24_4_ = fStack_5b28 * fVar45 + fStack_5b08 * fVar57 + fStack_5ae8 * fVar1;
                auVar124._28_4_ = fVar122 + in_ZMM14._28_4_ + auVar63._28_4_;
                fVar122 = *(float *)(uVar26 + 0xa0 + lVar32 * 4);
                auVar100._0_4_ =
                     (float)local_5b40._0_4_ * fVar46 +
                     (float)local_5b20._0_4_ * fVar84 + (float)local_5b00._0_4_ * fVar2;
                auVar100._4_4_ =
                     (float)local_5b40._4_4_ * fVar46 +
                     (float)local_5b20._4_4_ * fVar84 + (float)local_5b00._4_4_ * fVar2;
                auVar100._8_4_ = fStack_5b38 * fVar46 + fStack_5b18 * fVar84 + fStack_5af8 * fVar2;
                auVar100._12_4_ = fStack_5b34 * fVar46 + fStack_5b14 * fVar84 + fStack_5af4 * fVar2;
                auVar100._16_4_ = fStack_5b30 * fVar46 + fStack_5b10 * fVar84 + fStack_5af0 * fVar2;
                auVar100._20_4_ = fStack_5b2c * fVar46 + fStack_5b0c * fVar84 + fStack_5aec * fVar2;
                auVar100._24_4_ = fStack_5b28 * fVar46 + fStack_5b08 * fVar84 + fStack_5ae8 * fVar2;
                auVar100._28_4_ = fStack_5b24 + fStack_5b04 + fStack_5ae4;
                auVar132._8_4_ = 0x7fffffff;
                auVar132._0_8_ = 0x7fffffff7fffffff;
                auVar132._12_4_ = 0x7fffffff;
                auVar132._16_4_ = 0x7fffffff;
                auVar132._20_4_ = 0x7fffffff;
                auVar132._24_4_ = 0x7fffffff;
                auVar132._28_4_ = 0x7fffffff;
                auVar74 = vandps_avx(auVar112,auVar132);
                auVar94._8_4_ = 0x219392ef;
                auVar94._0_8_ = 0x219392ef219392ef;
                auVar94._12_4_ = 0x219392ef;
                auVar94._16_4_ = 0x219392ef;
                auVar94._20_4_ = 0x219392ef;
                auVar94._24_4_ = 0x219392ef;
                auVar94._28_4_ = 0x219392ef;
                auVar74 = vcmpps_avx(auVar74,auVar94,1);
                auVar51 = vblendvps_avx(auVar112,auVar94,auVar74);
                auVar74 = vandps_avx(auVar124,auVar132);
                auVar74 = vcmpps_avx(auVar74,auVar94,1);
                auVar78 = vblendvps_avx(auVar124,auVar94,auVar74);
                auVar74 = vandps_avx(auVar100,auVar132);
                auVar74 = vcmpps_avx(auVar74,auVar94,1);
                auVar74 = vblendvps_avx(auVar100,auVar94,auVar74);
                auVar71 = vrcpps_avx(auVar51);
                fVar97 = auVar71._0_4_;
                fVar102 = auVar71._4_4_;
                auVar10._4_4_ = fVar102 * auVar51._4_4_;
                auVar10._0_4_ = fVar97 * auVar51._0_4_;
                fVar103 = auVar71._8_4_;
                auVar10._8_4_ = fVar103 * auVar51._8_4_;
                fVar104 = auVar71._12_4_;
                auVar10._12_4_ = fVar104 * auVar51._12_4_;
                fVar105 = auVar71._16_4_;
                auVar10._16_4_ = fVar105 * auVar51._16_4_;
                fVar106 = auVar71._20_4_;
                auVar10._20_4_ = fVar106 * auVar51._20_4_;
                fVar107 = auVar71._24_4_;
                auVar10._24_4_ = fVar107 * auVar51._24_4_;
                auVar10._28_4_ = auVar51._28_4_;
                auVar95._8_4_ = 0x3f800000;
                auVar95._0_8_ = 0x3f8000003f800000;
                auVar95._12_4_ = 0x3f800000;
                auVar95._16_4_ = 0x3f800000;
                auVar95._20_4_ = 0x3f800000;
                auVar95._24_4_ = 0x3f800000;
                auVar95._28_4_ = 0x3f800000;
                auVar72 = vsubps_avx(auVar95,auVar10);
                fVar97 = fVar97 + fVar97 * auVar72._0_4_;
                fVar102 = fVar102 + fVar102 * auVar72._4_4_;
                fVar103 = fVar103 + fVar103 * auVar72._8_4_;
                fVar104 = fVar104 + fVar104 * auVar72._12_4_;
                fVar105 = fVar105 + fVar105 * auVar72._16_4_;
                fVar106 = fVar106 + fVar106 * auVar72._20_4_;
                fVar107 = fVar107 + fVar107 * auVar72._24_4_;
                auVar51 = vrcpps_avx(auVar78);
                fVar108 = auVar51._0_4_;
                fVar114 = auVar51._4_4_;
                auVar11._4_4_ = fVar114 * auVar78._4_4_;
                auVar11._0_4_ = fVar108 * auVar78._0_4_;
                fVar115 = auVar51._8_4_;
                auVar11._8_4_ = fVar115 * auVar78._8_4_;
                fVar116 = auVar51._12_4_;
                auVar11._12_4_ = fVar116 * auVar78._12_4_;
                fVar117 = auVar51._16_4_;
                auVar11._16_4_ = fVar117 * auVar78._16_4_;
                fVar118 = auVar51._20_4_;
                auVar11._20_4_ = fVar118 * auVar78._20_4_;
                fVar119 = auVar51._24_4_;
                auVar11._24_4_ = fVar119 * auVar78._24_4_;
                auVar11._28_4_ = auVar78._28_4_;
                auVar73 = vsubps_avx(auVar95,auVar11);
                fVar108 = fVar108 + fVar108 * auVar73._0_4_;
                fVar114 = fVar114 + fVar114 * auVar73._4_4_;
                fVar115 = fVar115 + fVar115 * auVar73._8_4_;
                fVar116 = fVar116 + fVar116 * auVar73._12_4_;
                fVar117 = fVar117 + fVar117 * auVar73._16_4_;
                fVar118 = fVar118 + fVar118 * auVar73._20_4_;
                fVar119 = fVar119 + fVar119 * auVar73._24_4_;
                auVar78 = vrcpps_avx(auVar74);
                fVar123 = auVar78._0_4_;
                fVar126 = auVar78._4_4_;
                auVar12._4_4_ = fVar126 * auVar74._4_4_;
                auVar12._0_4_ = fVar123 * auVar74._0_4_;
                fVar127 = auVar78._8_4_;
                auVar12._8_4_ = fVar127 * auVar74._8_4_;
                fVar128 = auVar78._12_4_;
                auVar12._12_4_ = fVar128 * auVar74._12_4_;
                fVar129 = auVar78._16_4_;
                auVar12._16_4_ = fVar129 * auVar74._16_4_;
                fVar130 = auVar78._20_4_;
                auVar12._20_4_ = fVar130 * auVar74._20_4_;
                fVar131 = auVar78._24_4_;
                auVar12._24_4_ = fVar131 * auVar74._24_4_;
                auVar12._28_4_ = auVar74._28_4_;
                auVar74 = vsubps_avx(auVar95,auVar12);
                fVar123 = fVar123 + fVar123 * auVar74._0_4_;
                fVar126 = fVar126 + fVar126 * auVar74._4_4_;
                fVar127 = fVar127 + fVar127 * auVar74._8_4_;
                fVar128 = fVar128 + fVar128 * auVar74._12_4_;
                fVar129 = fVar129 + fVar129 * auVar74._16_4_;
                fVar130 = fVar130 + fVar130 * auVar74._20_4_;
                fVar131 = fVar131 + fVar131 * auVar74._24_4_;
                fVar3 = *(float *)(uVar26 + 0xc0 + lVar32 * 4);
                fVar68 = fVar44 + fVar55 + fStack_5c38 + fVar47;
                auVar60._0_4_ =
                     -fVar97 * ((float)local_5ba0._0_4_ * fVar44 +
                               fVar55 * (float)local_5ba0._64_4_ + fStack_5c38 +
                               (float)local_5ba0._32_4_ * fVar47);
                auVar60._4_4_ =
                     -fVar102 *
                     ((float)local_5ba0._4_4_ * fVar44 +
                     fVar55 * (float)local_5ba0._68_4_ + fStack_5c38 +
                     (float)local_5ba0._36_4_ * fVar47);
                auVar60._8_4_ =
                     -fVar103 *
                     ((float)local_5ba0._8_4_ * fVar44 +
                     fVar55 * (float)local_5ba0._72_4_ + fStack_5c38 +
                     (float)local_5ba0._40_4_ * fVar47);
                auVar60._12_4_ =
                     -fVar104 *
                     ((float)local_5ba0._12_4_ * fVar44 +
                     fVar55 * (float)local_5ba0._76_4_ + fStack_5c38 +
                     (float)local_5ba0._44_4_ * fVar47);
                fVar65 = -fVar105 *
                         ((float)local_5ba0._16_4_ * fVar44 +
                         fVar55 * (float)local_5ba0._80_4_ + fStack_5c38 +
                         (float)local_5ba0._48_4_ * fVar47);
                auVar13._16_4_ = fVar65;
                auVar13._0_16_ = auVar60;
                fVar66 = -fVar106 *
                         ((float)local_5ba0._20_4_ * fVar44 +
                         fVar55 * (float)local_5ba0._84_4_ + fStack_5c38 +
                         (float)local_5ba0._52_4_ * fVar47);
                auVar13._20_4_ = fVar66;
                fVar67 = -fVar107 *
                         ((float)local_5ba0._24_4_ * fVar44 +
                         fVar55 * (float)local_5ba0._88_4_ + fStack_5c38 +
                         (float)local_5ba0._56_4_ * fVar47);
                auVar13._24_4_ = fVar67;
                auVar13._28_4_ = fVar68;
                fVar58 = fVar45 + fVar57 + fVar122 + fVar1;
                auVar49._0_4_ =
                     -fVar108 *
                     ((float)local_5ba0._0_4_ * fVar45 +
                     (float)local_5ba0._32_4_ * fVar57 + fVar122 + (float)local_5ba0._64_4_ * fVar1)
                ;
                auVar49._4_4_ =
                     -fVar114 *
                     ((float)local_5ba0._4_4_ * fVar45 +
                     (float)local_5ba0._36_4_ * fVar57 + fVar122 + (float)local_5ba0._68_4_ * fVar1)
                ;
                auVar49._8_4_ =
                     -fVar115 *
                     ((float)local_5ba0._8_4_ * fVar45 +
                     (float)local_5ba0._40_4_ * fVar57 + fVar122 + (float)local_5ba0._72_4_ * fVar1)
                ;
                auVar49._12_4_ =
                     -fVar116 *
                     ((float)local_5ba0._12_4_ * fVar45 +
                     (float)local_5ba0._44_4_ * fVar57 + fVar122 + (float)local_5ba0._76_4_ * fVar1)
                ;
                fVar55 = -fVar117 *
                         ((float)local_5ba0._16_4_ * fVar45 +
                         (float)local_5ba0._48_4_ * fVar57 +
                         fVar122 + (float)local_5ba0._80_4_ * fVar1);
                auVar14._16_4_ = fVar55;
                auVar14._0_16_ = auVar49;
                fVar56 = -fVar118 *
                         ((float)local_5ba0._20_4_ * fVar45 +
                         (float)local_5ba0._52_4_ * fVar57 +
                         fVar122 + (float)local_5ba0._84_4_ * fVar1);
                auVar14._20_4_ = fVar56;
                fVar57 = -fVar119 *
                         ((float)local_5ba0._24_4_ * fVar45 +
                         (float)local_5ba0._56_4_ * fVar57 +
                         fVar122 + (float)local_5ba0._88_4_ * fVar1);
                auVar14._24_4_ = fVar57;
                auVar14._28_4_ = fVar58;
                fVar47 = fVar46 + fVar84 + fVar3 + fVar2;
                auVar34._0_4_ =
                     ((float)local_5ba0._0_4_ * fVar46 +
                     (float)local_5ba0._32_4_ * fVar84 + fVar3 + (float)local_5ba0._64_4_ * fVar2) *
                     -fVar123;
                auVar34._4_4_ =
                     ((float)local_5ba0._4_4_ * fVar46 +
                     (float)local_5ba0._36_4_ * fVar84 + fVar3 + (float)local_5ba0._68_4_ * fVar2) *
                     -fVar126;
                auVar34._8_4_ =
                     ((float)local_5ba0._8_4_ * fVar46 +
                     (float)local_5ba0._40_4_ * fVar84 + fVar3 + (float)local_5ba0._72_4_ * fVar2) *
                     -fVar127;
                auVar34._12_4_ =
                     ((float)local_5ba0._12_4_ * fVar46 +
                     (float)local_5ba0._44_4_ * fVar84 + fVar3 + (float)local_5ba0._76_4_ * fVar2) *
                     -fVar128;
                fVar44 = ((float)local_5ba0._16_4_ * fVar46 +
                         (float)local_5ba0._48_4_ * fVar84 +
                         fVar3 + (float)local_5ba0._80_4_ * fVar2) * -fVar129;
                auVar15._16_4_ = fVar44;
                auVar15._0_16_ = auVar34;
                fVar45 = ((float)local_5ba0._20_4_ * fVar46 +
                         (float)local_5ba0._52_4_ * fVar84 +
                         fVar3 + (float)local_5ba0._84_4_ * fVar2) * -fVar130;
                auVar15._20_4_ = fVar45;
                fVar46 = ((float)local_5ba0._24_4_ * fVar46 +
                         (float)local_5ba0._56_4_ * fVar84 +
                         fVar3 + (float)local_5ba0._88_4_ * fVar2) * -fVar131;
                auVar15._24_4_ = fVar46;
                auVar15._28_4_ = fVar47;
                auVar70._0_4_ = fVar97 + auVar60._0_4_;
                auVar70._4_4_ = fVar102 + auVar60._4_4_;
                auVar70._8_4_ = fVar103 + auVar60._8_4_;
                auVar70._12_4_ = fVar104 + auVar60._12_4_;
                auVar76._16_4_ = fVar105 + fVar65;
                auVar76._0_16_ = auVar70;
                auVar76._20_4_ = fVar106 + fVar66;
                auVar76._24_4_ = fVar107 + fVar67;
                auVar76._28_4_ = auVar71._28_4_ + auVar72._28_4_ + fVar68;
                auVar77._0_4_ = fVar108 + auVar49._0_4_;
                auVar77._4_4_ = fVar114 + auVar49._4_4_;
                auVar77._8_4_ = fVar115 + auVar49._8_4_;
                auVar77._12_4_ = fVar116 + auVar49._12_4_;
                auVar80._16_4_ = fVar117 + fVar55;
                auVar80._0_16_ = auVar77;
                auVar80._20_4_ = fVar118 + fVar56;
                auVar80._24_4_ = fVar119 + fVar57;
                auVar80._28_4_ = auVar51._28_4_ + auVar73._28_4_ + fVar58;
                auVar81._0_4_ = fVar123 + auVar34._0_4_;
                auVar81._4_4_ = fVar126 + auVar34._4_4_;
                auVar81._8_4_ = fVar127 + auVar34._8_4_;
                auVar81._12_4_ = fVar128 + auVar34._12_4_;
                auVar82._16_4_ = fVar129 + fVar44;
                auVar82._0_16_ = auVar81;
                auVar82._20_4_ = fVar130 + fVar45;
                auVar82._24_4_ = fVar131 + fVar46;
                auVar82._28_4_ = auVar78._28_4_ + auVar74._28_4_ + fVar47;
                auVar48 = vpminsd_avx(auVar13._16_16_,auVar76._16_16_);
                auVar69 = vpminsd_avx(auVar60,auVar70);
                auVar59 = vpminsd_avx(auVar14._16_16_,auVar80._16_16_);
                auVar48 = vpmaxsd_avx(auVar48,auVar59);
                auVar59 = vpminsd_avx(auVar49,auVar77);
                auVar69 = vpmaxsd_avx(auVar69,auVar59);
                auVar59 = vpminsd_avx(auVar34,auVar81);
                auVar69 = vpmaxsd_avx(auVar69,auVar59);
                auVar96 = ZEXT1664(auVar69);
                auVar59 = vpminsd_avx(auVar15._16_16_,auVar82._16_16_);
                in_ZMM14 = ZEXT1664(auVar59);
                auVar48 = vpmaxsd_avx(auVar48,auVar59);
                auVar90._16_16_ = auVar48;
                auVar90._0_16_ = auVar69;
                auVar59 = vpmaxsd_avx(auVar13._16_16_,auVar76._16_16_);
                auVar110 = vpmaxsd_avx(auVar60,auVar70);
                auVar98 = vpmaxsd_avx(auVar14._16_16_,auVar80._16_16_);
                auVar113 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                              CONCAT424(0x3f7ffffa,
                                                        CONCAT420(0x3f7ffffa,
                                                                  CONCAT416(0x3f7ffffa,
                                                                            CONCAT412(0x3f7ffffa,
                                                                                      CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                auVar101 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar98 = vpminsd_avx(auVar59,auVar98);
                auVar59 = vpmaxsd_avx(auVar49,auVar77);
                auVar110 = vpminsd_avx(auVar110,auVar59);
                auVar59 = vpmaxsd_avx(auVar34,auVar81);
                auVar110 = vpminsd_avx(auVar110,auVar59);
                auVar59 = vpmaxsd_avx(auVar15._16_16_,auVar82._16_16_);
                auVar121 = ZEXT3264(CONCAT428(0x3f800003,
                                              CONCAT424(0x3f800003,
                                                        CONCAT420(0x3f800003,
                                                                  CONCAT416(0x3f800003,
                                                                            CONCAT412(0x3f800003,
                                                                                      CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                auVar59 = vpminsd_avx(auVar98,auVar59);
                auVar35._0_4_ = auVar69._0_4_ * 0.99999964;
                auVar35._4_4_ = auVar69._4_4_ * 0.99999964;
                auVar35._8_4_ = auVar69._8_4_ * 0.99999964;
                auVar35._12_4_ = auVar69._12_4_ * 0.99999964;
                auVar36._16_4_ = auVar48._0_4_ * 0.99999964;
                auVar36._0_16_ = auVar35;
                auVar36._20_4_ = auVar48._4_4_ * 0.99999964;
                auVar36._24_4_ = auVar48._8_4_ * 0.99999964;
                auVar42._28_4_ = 0;
                auVar42._0_28_ = auVar36;
                auVar50._0_4_ = auVar110._0_4_ * 1.0000004;
                auVar50._4_4_ = auVar110._4_4_ * 1.0000004;
                auVar50._8_4_ = auVar110._8_4_ * 1.0000004;
                auVar50._12_4_ = auVar110._12_4_ * 1.0000004;
                auVar16._16_4_ = auVar59._0_4_ * 1.0000004;
                auVar16._0_16_ = auVar50;
                auVar16._20_4_ = auVar59._4_4_ * 1.0000004;
                auVar16._24_4_ = auVar59._8_4_ * 1.0000004;
                auVar16._28_4_ = auVar59._12_4_;
                auVar48 = vpmaxsd_avx(auVar35,local_5a20._0_16_);
                auVar69._12_4_ = 0;
                auVar69._0_12_ = auVar36._16_12_;
                auVar69 = vpmaxsd_avx(auVar69,local_5a20._16_16_);
                auVar59 = vpminsd_avx(auVar50,local_5a00._0_16_);
                auVar61._16_16_ = auVar69;
                auVar61._0_16_ = auVar48;
                auVar48 = vpminsd_avx(auVar16._16_16_,local_5a00._16_16_);
                auVar53._16_16_ = auVar48;
                auVar53._0_16_ = auVar59;
                fStack_5c34 = fStack_5c38;
                fStack_5c30 = fStack_5c38;
                fStack_5c2c = fStack_5c38;
                fStack_5c28 = fStack_5c38;
                fStack_5c24 = fStack_5c38;
                local_5c20 = auVar63;
              }
              auVar91 = ZEXT3264(auVar90);
              auVar83 = ZEXT3264(auVar82);
              auVar74 = vcmpps_avx(auVar61,auVar53,2);
              auVar48 = vpackssdw_avx(auVar74._0_16_,auVar74._16_16_);
              auVar69 = vpmovzxwd_avx(auVar48);
              auVar59 = vpslld_avx(auVar69,0x1f);
              auVar64 = ZEXT1664(auVar59);
              auVar69 = vpunpckhwd_avx(auVar48,auVar48);
              auVar69 = vpslld_avx(auVar69,0x1f);
              auVar75._16_16_ = auVar69;
              auVar75._0_16_ = auVar59;
              uVar22 = uVar30;
              auVar74 = auVar63;
              if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar75 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar75 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar75 >> 0x7f,0) != '\0') ||
                    (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB161(auVar69 >> 0x3f,0) != '\0') ||
                  (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar69[0xf] < '\0') {
                auVar48 = vpunpckhwd_avx(auVar48,auVar48);
                auVar48 = vpslld_avx(auVar48,0x1f);
                auVar52._16_16_ = auVar48;
                auVar52._0_16_ = auVar59;
                auVar74 = vblendvps_avx(auVar101._0_32_,auVar42,auVar52);
                uVar22 = uVar5;
                if (uVar30 != 8) {
                  *puVar31 = uVar30;
                  puVar31 = puVar31 + 1;
                  *pauVar33 = auVar63;
                  pauVar33 = pauVar33 + 1;
                }
              }
              auVar63 = auVar74;
              uVar30 = uVar22;
            }
            if (uVar30 == 8) goto LAB_010350c1;
            auVar74 = vcmpps_avx(local_5a00._0_32_,auVar63,6);
            uVar28 = vmovmskps_avx(auVar74);
            root.ptr = uVar30;
          } while ((byte)uVar29 < (byte)POPCOUNT(uVar28));
          *puVar31 = uVar30;
          puVar31 = puVar31 + 1;
          *pauVar33 = auVar63;
          pauVar33 = pauVar33 + 1;
LAB_010350c1:
          iVar25 = 4;
        }
        else {
          while (local_5c20 = auVar63, local_5c58 = uVar26, auVar48 = auVar64._0_16_,
                local_5c40 != (undefined8 *)0x0) {
            local_5c00 = 0;
            if (local_5c40 != (undefined8 *)0x0) {
              for (; ((ulong)local_5c40 >> local_5c00 & 1) == 0; local_5c00 = local_5c00 + 1) {
              }
            }
            local_5c40 = (undefined8 *)((ulong)local_5c40 & (long)local_5c40 - 1U);
            auVar64 = ZEXT1664(auVar48);
            auVar83 = ZEXT1664(auVar83._0_16_);
            auVar91 = ZEXT1664(auVar91._0_16_);
            auVar96 = ZEXT1664(auVar96._0_16_);
            in_ZMM14 = ZEXT1664(in_ZMM14._0_16_);
            bVar24 = occluded1(This,local_5c50,root,local_5c00,(Precalculations *)&local_59c0,ray,
                               (TravRayK<8,_true> *)&local_5ba0.field_0,context);
            uVar26 = local_5c58;
            auVar63 = local_5c20;
            if (bVar24) {
              *(undefined4 *)(local_5c80 + local_5c00 * 4) = 0xffffffff;
              uVar26 = local_5c58;
              auVar63 = local_5c20;
            }
          }
          auVar48 = vpcmpeqd_avx(auVar48,auVar48);
          auVar69 = vpcmpgtd_avx(stack0xffffffffffffa390,auVar48);
          auVar48 = vpcmpgtd_avx(local_5c80._0_16_,auVar48);
          auVar64 = ZEXT1664(auVar48);
          auVar48 = vpor_avx(auVar48,auVar69);
          iVar25 = 3;
          auVar101 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar113 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                        CONCAT424(0x3f7ffffa,
                                                  CONCAT420(0x3f7ffffa,
                                                            CONCAT416(0x3f7ffffa,
                                                                      CONCAT412(0x3f7ffffa,
                                                                                CONCAT48(0x3f7ffffa,
                                                                                                                                                                                  
                                                  0x3f7ffffa3f7ffffa)))))));
          auVar121 = ZEXT3264(CONCAT428(0x3f800003,
                                        CONCAT424(0x3f800003,
                                                  CONCAT420(0x3f800003,
                                                            CONCAT416(0x3f800003,
                                                                      CONCAT412(0x3f800003,
                                                                                CONCAT48(0x3f800003,
                                                                                                                                                                                  
                                                  0x3f8000033f800003)))))));
          auVar125 = ZEXT3264(local_5c20);
          if ((((auVar48 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar48 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar48 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar48[0xf] < '\0') {
            auVar63._8_4_ = 0xff800000;
            auVar63._0_8_ = 0xff800000ff800000;
            auVar63._12_4_ = 0xff800000;
            auVar63._16_4_ = 0xff800000;
            auVar63._20_4_ = 0xff800000;
            auVar63._24_4_ = 0xff800000;
            auVar63._28_4_ = 0xff800000;
            auVar64 = ZEXT3264(auVar63);
            local_5a00._0_32_ = vblendvps_avx(local_5a00._0_32_,auVar63,_local_5c80);
            iVar25 = 2;
          }
          uVar30 = 0;
          if ((uint)uVar29 < (uint)local_5c58) goto LAB_01034bf8;
          uVar30 = 0;
        }
      } while (iVar25 != 3);
LAB_0103532d:
      auVar63 = vandps_avx(local_5be0,_local_5c80);
      auVar54._8_4_ = 0xff800000;
      auVar54._0_8_ = 0xff800000ff800000;
      auVar54._12_4_ = 0xff800000;
      auVar54._16_4_ = 0xff800000;
      auVar54._20_4_ = 0xff800000;
      auVar54._24_4_ = 0xff800000;
      auVar54._28_4_ = 0xff800000;
      auVar63 = vmaskmovps_avx(auVar63,auVar54);
      *(undefined1 (*) [32])local_5c48 = auVar63;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }